

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNdr.c
# Opt level: O3

void * Wln_NtkToNdr(Wln_Ntk_t *p)

{
  int InstName;
  Vec_Int_t *pVVar1;
  int iVar2;
  Ndr_Data_t *pNVar3;
  uchar *puVar4;
  uint *puVar5;
  long lVar6;
  ulong uVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  int *pOutputs;
  uint uVar10;
  Wln_Vec_t *pWVar11;
  int RangeLeft;
  int RangeRight;
  long lVar12;
  int *piVar13;
  int *in_stack_ffffffffffffff88;
  char *pcVar14;
  int local_54;
  Ndr_Data_t *p_1;
  int *local_48;
  int local_40;
  int local_3c;
  ulong local_38;
  
  pNVar3 = (Ndr_Data_t *)malloc(0x18);
  pNVar3->nCap = 0x10;
  puVar4 = (uchar *)malloc(0x10);
  pNVar3->pHead = puVar4;
  pcVar14 = (char *)0x380424;
  puVar5 = (uint *)malloc(0x100);
  pNVar3->pBody = puVar5;
  builtin_memcpy(puVar4,"\x01\a\x02\a",4);
  pNVar3->nSize = 4;
  puVar5[0] = 4;
  puVar5[1] = 1;
  puVar5[2] = 2;
  puVar5[3] = 1;
  uVar10 = (p->vCis).nSize;
  uVar7 = (ulong)uVar10;
  p_1 = pNVar3;
  if ((p->vFfs).nSize < (int)uVar10) {
    lVar12 = 0;
    do {
      if ((int)uVar7 <= lVar12) goto LAB_003807d1;
      local_54 = (p->vCis).pArray[lVar12];
      lVar6 = (long)local_54;
      if ((lVar6 < 0) || ((p->vRanges).nSize <= local_54)) goto LAB_003807d1;
      iVar2 = (p->vRanges).pArray[lVar6];
      if (iVar2 < 0) goto LAB_003807f0;
      pVVar8 = p->pRanges->vObjs;
      uVar10 = iVar2 * 4;
      if (pVVar8->nSize <= (int)uVar10) goto LAB_003807f0;
      if ((p->vSigns).nSize <= local_54) goto LAB_0038080f;
      piVar9 = pVVar8->pArray;
      in_stack_ffffffffffffff88 = (int *)0x0;
      Ndr_AddObject(p_1,0x102,3,piVar9[uVar10],piVar9[(ulong)uVar10 + 1],
                    (int)(p->vSigns).pArray[lVar6],0,0,(int *)0x1,(int)&local_54,(int *)0x0,pcVar14)
      ;
      lVar12 = lVar12 + 1;
      uVar7 = (ulong)(p->vCis).nSize;
    } while (lVar12 < (long)(uVar7 - (long)(p->vFfs).nSize));
  }
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 0x10;
  pVVar8->nSize = 0;
  pcVar14 = (char *)0x38052c;
  piVar9 = (int *)malloc(0x40);
  pVVar8->pArray = piVar9;
  local_54 = 1;
  iVar2 = (p->vTypes).nSize;
  if (1 < iVar2) {
    lVar12 = 1;
    piVar13 = (int *)0x18;
    do {
      if ((p->vTypes).pArray[lVar12] - 5U < 0xfffffffe) {
        pVVar8->nSize = 0;
        pWVar11 = p->vFanins;
        uVar7 = (ulong)(uint)pWVar11[lVar12].nSize;
        if (0 < pWVar11[lVar12].nSize) {
          lVar6 = 0;
          local_48 = piVar13;
          do {
            if ((int)uVar7 < 3) {
              piVar9 = (int *)((long)&pWVar11->nCap + (long)piVar13);
            }
            else {
              piVar9 = pWVar11[lVar12].field_2.pArray[0] + lVar6;
            }
            if (*piVar9 != 0) {
              pcVar14 = (char *)0x3805ba;
              Vec_IntPush(pVVar8,*piVar9);
              pWVar11 = p->vFanins;
            }
            lVar6 = lVar6 + 1;
            uVar7 = (ulong)pWVar11[lVar12].nSize;
            piVar13 = piVar13 + 1;
          } while (lVar6 < (long)uVar7);
          iVar2 = (p->vTypes).nSize;
          piVar13 = local_48;
        }
        if ((iVar2 <= lVar12) || ((p->vRanges).nSize <= lVar12)) goto LAB_003807d1;
        iVar2 = (p->vRanges).pArray[lVar12];
        if (iVar2 < 0) goto LAB_003807f0;
        pVVar1 = p->pRanges->vObjs;
        uVar10 = iVar2 * 4;
        if (pVVar1->nSize <= (int)uVar10) goto LAB_003807f0;
        if ((p->vSigns).nSize <= lVar12) goto LAB_0038080f;
        iVar2 = (p->vTypes).pArray[lVar12];
        piVar9 = pVVar1->pArray;
        InstName = piVar9[uVar10];
        RangeLeft = piVar9[(ulong)uVar10 + 1];
        RangeRight = (int)(p->vSigns).pArray[lVar12];
        uVar7 = (ulong)(uint)pVVar8->nSize;
        local_48 = pVVar8->pArray;
        if (iVar2 == 0x61) {
          pcVar14 = (char *)0x380674;
          local_40 = RangeRight;
          local_3c = RangeLeft;
          local_38 = uVar7;
          pOutputs = (int *)Wln_ObjConstString(p,(int)lVar12);
          uVar7 = local_38;
          RangeLeft = local_3c;
          RangeRight = local_40;
        }
        else {
          pOutputs = (int *)0x0;
        }
        piVar9 = local_48;
        in_stack_ffffffffffffff88 = (int *)0x0;
        Ndr_AddObject(p_1,0x102,iVar2,InstName,RangeLeft,RangeRight,(int)uVar7,(int)local_48,
                      (int *)0x1,(int)&local_54,pOutputs,pcVar14);
        iVar2 = (p->vTypes).nSize;
      }
      lVar12 = lVar12 + 1;
      local_54 = (int)lVar12;
      piVar13 = piVar13 + 4;
    } while (lVar12 < iVar2);
  }
  if (piVar9 != (int *)0x0) {
    free(piVar9);
  }
  pcVar14 = (char *)0x3806e5;
  free(pVVar8);
  uVar10 = (p->vCos).nSize;
  uVar7 = (ulong)uVar10;
  if ((p->vFfs).nSize < (int)uVar10) {
    lVar12 = 0;
    do {
      if ((int)uVar7 <= lVar12) {
LAB_003807d1:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      local_54 = (p->vCos).pArray[lVar12];
      lVar6 = (long)local_54;
      if ((lVar6 < 0) || ((p->vRanges).nSize <= local_54)) goto LAB_003807d1;
      iVar2 = (p->vRanges).pArray[lVar6];
      if (iVar2 < 0) {
LAB_003807f0:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      pVVar8 = p->pRanges->vObjs;
      uVar10 = iVar2 * 4;
      if (pVVar8->nSize <= (int)uVar10) goto LAB_003807f0;
      if ((p->vSigns).nSize <= local_54) {
LAB_0038080f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      piVar9 = pVVar8->pArray;
      in_stack_ffffffffffffff88 = (int *)((ulong)in_stack_ffffffffffffff88 & 0xffffffff00000000);
      Ndr_AddObject(p_1,0x102,4,piVar9[uVar10],piVar9[(ulong)uVar10 + 1],
                    (int)(p->vSigns).pArray[lVar6],1,(int)&local_54,in_stack_ffffffffffffff88,0,
                    (int *)0x0,pcVar14);
      lVar12 = lVar12 + 1;
      uVar7 = (ulong)(p->vCos).nSize;
    } while (lVar12 < (long)(uVar7 - (long)(p->vFfs).nSize));
  }
  return p_1;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void * Wln_NtkToNdr( Wln_Ntk_t * p )
{
    Vec_Int_t * vFanins;
    int i, k, iObj, iFanin;
    // create a new module
    void * pDesign = Ndr_Create( 1 );
    int ModId = Ndr_AddModule( pDesign, 1 );
    // add primary inputs
    Wln_NtkForEachPi( p, iObj, i ) 
    {
        Ndr_AddObject( pDesign, ModId, ABC_OPER_CI, 0,   
            Wln_ObjRangeEnd(p, iObj), Wln_ObjRangeBeg(p, iObj), Wln_ObjIsSigned(p, iObj),   
            0, NULL,  1, &iObj,  NULL  ); // no fanins
    }
    // add internal nodes 
    vFanins = Vec_IntAlloc( 10 );
    Wln_NtkForEachObjInternal( p, iObj ) 
    {
        Vec_IntClear( vFanins );
        Wln_ObjForEachFanin( p, iObj, iFanin, k )
            Vec_IntPush( vFanins, iFanin );
        Ndr_AddObject( pDesign, ModId, Wln_ObjType(p, iObj), 0,   
            Wln_ObjRangeEnd(p, iObj), Wln_ObjRangeBeg(p, iObj), Wln_ObjIsSigned(p, iObj),   
            Vec_IntSize(vFanins), Vec_IntArray(vFanins), 1, &iObj,  
            Wln_ObjIsConst(p, iObj) ? Wln_ObjConstString(p, iObj) : NULL ); 
    }
    Vec_IntFree( vFanins );
    // add primary outputs
    Wln_NtkForEachPo( p, iObj, i ) 
    {
        Ndr_AddObject( pDesign, ModId, ABC_OPER_CO, 0,                   
            Wln_ObjRangeEnd(p, iObj), Wln_ObjRangeBeg(p, iObj), Wln_ObjIsSigned(p, iObj),   
            1, &iObj,  0, NULL,  NULL ); 
    }
    return pDesign;
}